

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roots.h
# Opt level: O2

MatrixXd *
ChebTools::rootfinding::companion_matrix_transposed
          (MatrixXd *__return_storage_ptr__,ArrayXd *coeffs)

{
  long lVar1;
  Scalar *pSVar2;
  CoeffReturnType pdVar3;
  long lVar4;
  double local_148;
  Type local_140;
  PointerType local_108;
  long lStack_100;
  undefined8 local_f8;
  XprTypeNested pAStack_f0;
  long local_e8;
  undefined8 uStack_e0;
  Index local_d8;
  Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> local_c8;
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,_1,_0,__1,_1>_>_>
  local_90;
  
  lVar4 = (coeffs->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  lVar1 = lVar4 + -1;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::Zero
            ((ConstantReturnType *)&local_90,lVar1,lVar1);
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)__return_storage_ptr__,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)&local_90);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,1,0);
  *pSVar2 = 1.0;
  Eigen::DenseBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>_>::head<long>
            (&local_140,(DenseBase<Eigen::Array<double,__1,_1,_0,__1,_1>_> *)coeffs,lVar1);
  local_d8 = local_140.super_Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
             super_BlockImpl<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
             .super_BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
             .m_outerStride;
  local_e8 = local_140.super_Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
             super_BlockImpl<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
             .super_BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
             .m_startRow.m_value;
  uStack_e0 = local_140.super_Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
              ._40_8_;
  local_f8 = local_140.super_Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
             super_BlockImpl<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
             .super_BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
             .
             super_MapBase<Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
             ._16_8_;
  pAStack_f0 = local_140.super_Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
               super_BlockImpl<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
               .m_xpr;
  local_108 = local_140.super_Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
              super_BlockImpl<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
              .
              super_BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
              .
              super_MapBase<Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
              .m_data;
  lStack_100 = local_140.super_Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>.
               super_BlockImpl<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_Eigen::Dense>
               .
               super_BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
               .
               super_MapBase<Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
               .m_rows.m_value;
  pdVar3 = Eigen::DenseCoeffsBase<Eigen::Array<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                     ((DenseCoeffsBase<Eigen::Array<double,__1,_1,_0,__1,_1>,_0> *)coeffs,lVar1);
  local_148 = *pdVar3 + *pdVar3;
  Eigen::
  ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Array<double,-1,1,0,-1,1>const,-1,1,false>const>>
  ::operator/(&local_90,
              (ArrayBase<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>const,_1,1,false>const>>
               *)&local_108,&local_148);
  lVar1 = lVar4 + -2;
  Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>::Block
            (&local_c8,__return_storage_ptr__,lVar1);
  Eigen::internal::
  call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Block<Eigen::Array<double,_1,1,0,_1,1>const,_1,1,false>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Array<double,_1,1,0,_1,1>const>const>>
            (&local_c8,&local_90);
  pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                      __return_storage_ptr__,lVar4 + -3,lVar1);
  *pSVar2 = *pSVar2 + 0.5;
  for (lVar4 = 1; lVar4 < lVar1; lVar4 = lVar4 + 1) {
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,lVar4 + -1,lVar4);
    *pSVar2 = 0.5;
    pSVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_1>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_1> *)
                        __return_storage_ptr__,lVar4 + 1,lVar4);
    *pSVar2 = 0.5;
  }
  return __return_storage_ptr__;
}

Assistant:

inline Eigen::MatrixXd companion_matrix_transposed(const Eigen::ArrayXd &coeffs) {
    auto N = coeffs.size() - 1; // degree
    Eigen::MatrixXd A = Eigen::MatrixXd::Zero(N, N);
    // First col
    A(1, 0) = 1;
    // Last col
    A.col(N-1) = -coeffs.head(N)/(2.0*coeffs(N));
    A(N - 2, N - 1) += 0.5;
    // All the other cols
    for (int j = 1; j < N - 1; ++j) {
        A(j - 1, j) = 0.5;
        A(j + 1, j) = 0.5;
    }
    return A;
}